

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

ssize_t Curl_send_plain(connectdata *conn,int num,void *mem,size_t len,CURLcode *code)

{
  int err_00;
  SessionHandle *data;
  int *piVar1;
  char *pcVar2;
  ssize_t sStack_40;
  int err;
  ssize_t bytes_written;
  curl_socket_t sockfd;
  CURLcode *code_local;
  size_t len_local;
  void *mem_local;
  int num_local;
  connectdata *conn_local;
  
  sStack_40 = send(conn->sock[num],mem,len,0x4000);
  *code = CURLE_OK;
  if (sStack_40 == -1) {
    piVar1 = __errno_location();
    err_00 = *piVar1;
    if (((err_00 == 0xb) || (err_00 == 0xb)) || (err_00 == 4)) {
      sStack_40 = 0;
      *code = CURLE_AGAIN;
    }
    else {
      data = conn->data;
      pcVar2 = Curl_strerror(conn,err_00);
      Curl_failf(data,"Send failure: %s",pcVar2);
      (conn->data->state).os_errno = err_00;
      *code = CURLE_SEND_ERROR;
    }
  }
  return sStack_40;
}

Assistant:

ssize_t Curl_send_plain(struct connectdata *conn, int num,
                        const void *mem, size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t bytes_written = swrite(sockfd, mem, len);

  *code = CURLE_OK;
  if(-1 == bytes_written) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefor
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      bytes_written=0;
      *code = CURLE_AGAIN;
    }
    else {
      failf(conn->data, "Send failure: %s",
            Curl_strerror(conn, err));
      conn->data->state.os_errno = err;
      *code = CURLE_SEND_ERROR;
    }
  }
  return bytes_written;
}